

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O2

int ReadPNG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  char *__s1;
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __jmp_buf_tag *__env;
  ulong uVar5;
  long lVar6;
  png_structp ppVar7;
  double dVar8;
  uint uVar9;
  uint64_t stride;
  png_structp png;
  double image_gamma;
  png_infop info;
  png_uint_32 height;
  int ok;
  int color_type;
  uint8_t *rgb;
  png_infop end_info;
  int local_b8;
  png_uint_32 width;
  Metadata *local_b0;
  int local_a4;
  int local_a0;
  uint local_9c;
  int bit_depth;
  uint local_94;
  WebPPicture *local_90;
  png_infop local_88;
  MetadataPayload *local_80;
  png_infop local_78;
  png_infop local_70;
  png_structp local_68;
  png_bytep profile;
  int srgb_intent;
  int interlaced;
  int comp_type;
  uint8_t *local_48;
  size_t local_40;
  undefined8 local_38;
  
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  end_info = (png_infop)0x0;
  local_38 = 0;
  ok = 0;
  rgb = (uint8_t *)0x0;
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  local_b0 = metadata;
  local_48 = data;
  local_40 = data_size;
  png = (png_structp)png_create_read_struct_2("1.6.37",0,0,0,0,MallocFunc,FreeFunc);
  if (png != (png_structp)0x0) {
    png_set_error_fn(png,0,error_function);
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      uVar5 = png_get_chunk_malloc_max(png);
      if ((data_size < 0x1000000) && (uVar5 < data_size)) {
        png_set_chunk_malloc_max(png,data_size);
      }
      info = (png_infop)png_create_info_struct(png);
      if ((info != (png_infop)0x0) &&
         (end_info = (png_infop)png_create_info_struct(png), end_info != (png_infop)0x0)) {
        png_set_read_fn(png,&local_48,ReadFunc);
        png_read_info(png,info);
        iVar2 = png_get_IHDR(png,info,&width,&height,&bit_depth,&color_type,&interlaced,0,0);
        if (iVar2 != 0) {
          png_set_strip_16(png);
          png_set_packing(png);
          if (color_type == 3) {
            png_set_palette_to_rgb(png);
          }
          if ((color_type & 0xfffffffbU) == 0) {
            if (bit_depth < 8) {
              png_set_expand_gray_1_2_4_to_8(png);
            }
            png_set_gray_to_rgb(png);
          }
          iVar2 = png_get_valid(png,info,0x10);
          if (iVar2 == 0) {
            uVar9 = (uint)color_type >> 2 & 1;
          }
          else {
            png_set_tRNS_to_alpha(png);
            uVar9 = 1;
          }
          image_gamma = 0.45454545454545453;
          iVar2 = png_get_sRGB(png,info,&srgb_intent);
          if ((iVar2 != 0) || (iVar2 = png_get_gAMA(png,info,&image_gamma), iVar2 != 0)) {
            png_set_gamma(0x9999999a,image_gamma,png);
          }
          if (keep_alpha == 0) {
            png_set_strip_alpha(png);
            uVar9 = 0;
          }
          iVar2 = png_set_interlace_handling(png);
          png_read_update_info(png,info);
          stride = (ulong)width * (4 - (ulong)(uVar9 == 0));
          local_9c = uVar9;
          if ((stride < 0x80000000) &&
             (iVar3 = ImgIoUtilCheckSizeArgumentsOverflow(stride,(ulong)height), iVar3 != 0)) {
            uVar5 = (ulong)height;
            rgb = (uint8_t *)malloc(stride * uVar5);
            if (rgb != (uint8_t *)0x0) {
              local_b8 = (int)stride;
              if (iVar2 < 1) {
                iVar2 = 0;
              }
              local_a4 = iVar2;
              local_90 = pic;
              for (iVar3 = 0; iVar3 != local_a4; iVar3 = iVar3 + 1) {
                image_gamma = (double)rgb;
                for (uVar9 = 0; uVar9 < (uint)uVar5; uVar9 = uVar9 + 1) {
                  png_read_rows(png,&image_gamma,0,1);
                  image_gamma = (double)((long)image_gamma + stride);
                  uVar5 = (ulong)height;
                }
              }
              png_read_end(png,end_info);
              if (local_b0 != (Metadata *)0x0) {
                local_70 = info;
                local_78 = end_info;
                local_80 = &local_b0->iccp;
                local_68 = png;
                iVar2 = 0;
                ppVar7 = png;
                while (iVar2 != 2) {
                  local_88 = local_78;
                  if (iVar2 == 0) {
                    local_88 = local_70;
                  }
                  image_gamma = 0.0;
                  local_a0 = iVar2;
                  iVar2 = png_get_text(ppVar7,local_88,&image_gamma,0);
                  for (iVar3 = 0; ppVar7 = local_68, dVar8 = image_gamma, iVar3 != iVar2;
                      iVar3 = iVar3 + 1) {
                    __s1 = *(char **)((long)image_gamma + 8);
                    lVar1 = 0;
                    do {
                      lVar6 = lVar1;
                      if (lVar6 + 0x18 == 0x78) goto LAB_00106195;
                      iVar4 = strcmp(__s1,*(char **)((long)&kPNGMetadataMap[0].name + lVar6));
                      lVar1 = lVar6 + 0x18;
                    } while (iVar4 != 0);
                    lVar1 = *(long *)((long)&kPNGMetadataMap[0].storage_offset + lVar6);
                    if (*(long *)((long)&(local_b0->exif).bytes + lVar1) == 0) {
                      iVar4 = (**(code **)((long)&kPNGMetadataMap[0].process + lVar6))
                                        (*(undefined8 *)((long)dVar8 + 0x10),
                                         *(undefined8 *)
                                          ((long)dVar8 + 0x18 + (ulong)(*(int *)dVar8 - 1U < 2) * 8)
                                         ,(long)&(local_b0->exif).bytes + lVar1);
                      dVar8 = image_gamma;
                      if (iVar4 == 0) {
                        fprintf(_stderr,"Failed to process: \'%s\'\n",
                                *(undefined8 *)((long)image_gamma + 8));
                        goto LAB_00106275;
                      }
                    }
                    else {
                      fprintf(_stderr,"Ignoring additional \'%s\'\n",__s1);
                      dVar8 = image_gamma;
                    }
LAB_00106195:
                    image_gamma = (double)((long)dVar8 + 0x38);
                  }
                  iVar2 = png_get_iCCP(local_68,local_88,&srgb_intent,&comp_type,&profile,&local_94)
                  ;
                  if ((iVar2 == 0x1000) &&
                     (iVar2 = MetadataCopy((char *)profile,(ulong)local_94,local_80), iVar2 == 0)) {
LAB_00106275:
                    fwrite("Error extracting PNG metadata!\n",0x1f,1,_stderr);
                    goto LAB_00105daf;
                  }
                  iVar2 = local_a0 + 1;
                }
              }
              local_90->width = width;
              local_90->height = height;
              if (local_9c == 0) {
                ok = WebPPictureImportRGB(local_90,rgb,local_b8);
              }
              else {
                ok = WebPPictureImportRGBA(local_90,rgb,local_b8);
              }
              if (ok != 0) goto LAB_00105db9;
            }
          }
        }
      }
    }
LAB_00105daf:
    MetadataFree(local_b0);
  }
LAB_00105db9:
  if (png != (png_structp)0x0) {
    png_destroy_read_struct(&png,&info,&end_info);
  }
  free(rgb);
  return ok;
}

Assistant:

int ReadPNG(const uint8_t* const data, size_t data_size,
            struct WebPPicture* const pic,
            int keep_alpha, struct Metadata* const metadata) {
  volatile png_structp png = NULL;
  volatile png_infop info = NULL;
  volatile png_infop end_info = NULL;
  PNGReadContext context = { NULL, 0, 0 };
  int color_type, bit_depth, interlaced;
  int has_alpha;
  int num_passes;
  int p;
  volatile int ok = 0;
  png_uint_32 width, height, y;
  int64_t stride;
  uint8_t* volatile rgb = NULL;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  context.data = data;
  context.data_size = data_size;

  png = png_create_read_struct_2(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL,
                                 NULL, MallocFunc, FreeFunc);
  if (png == NULL) goto End;

  png_set_error_fn(png, 0, error_function, NULL);
  if (setjmp(png_jmpbuf(png))) {
 Error:
    MetadataFree(metadata);
    goto End;
  }

#if LOCAL_PNG_PREREQ(1,5) || \
    (LOCAL_PNG_PREREQ(1,4) && PNG_LIBPNG_VER_RELEASE >= 1)
  // If it looks like the bitstream is going to need more memory than libpng's
  // internal limit (default: 8M), try to (reasonably) raise it.
  if (data_size > png_get_chunk_malloc_max(png) && data_size < (1u << 24)) {
    png_set_chunk_malloc_max(png, data_size);
  }
#endif

  info = png_create_info_struct(png);
  if (info == NULL) goto Error;
  end_info = png_create_info_struct(png);
  if (end_info == NULL) goto Error;

  png_set_read_fn(png, &context, ReadFunc);
  png_read_info(png, info);
  if (!png_get_IHDR(png, info,
                    &width, &height, &bit_depth, &color_type, &interlaced,
                    NULL, NULL)) goto Error;

  png_set_strip_16(png);
  png_set_packing(png);
  if (color_type == PNG_COLOR_TYPE_PALETTE) {
    png_set_palette_to_rgb(png);
  }
  if (color_type == PNG_COLOR_TYPE_GRAY ||
      color_type == PNG_COLOR_TYPE_GRAY_ALPHA) {
    if (bit_depth < 8) {
      png_set_expand_gray_1_2_4_to_8(png);
    }
    png_set_gray_to_rgb(png);
  }
  if (png_get_valid(png, info, PNG_INFO_tRNS)) {
    png_set_tRNS_to_alpha(png);
    has_alpha = 1;
  } else {
    has_alpha = !!(color_type & PNG_COLOR_MASK_ALPHA);
  }

  // Apply gamma correction if needed.
  {
    double image_gamma = 1 / 2.2, screen_gamma = 2.2;
    int srgb_intent;
    if (png_get_sRGB(png, info, &srgb_intent) ||
        png_get_gAMA(png, info, &image_gamma)) {
      png_set_gamma(png, screen_gamma, image_gamma);
    }
  }

  if (!keep_alpha) {
    png_set_strip_alpha(png);
    has_alpha = 0;
  }

  num_passes = png_set_interlace_handling(png);
  png_read_update_info(png, info);

  stride = (int64_t)(has_alpha ? 4 : 3) * width * sizeof(*rgb);
  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) goto Error;
  for (p = 0; p < num_passes; ++p) {
    png_bytep row = rgb;
    for (y = 0; y < height; ++y) {
      png_read_rows(png, &row, NULL, 1);
      row += stride;
    }
  }
  png_read_end(png, end_info);

  if (metadata != NULL &&
      !ExtractMetadataFromPNG(png, info, end_info, metadata)) {
    fprintf(stderr, "Error extracting PNG metadata!\n");
    goto Error;
  }

  pic->width = (int)width;
  pic->height = (int)height;
  ok = has_alpha ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                 : WebPPictureImportRGB(pic, rgb, (int)stride);

  if (!ok) {
    goto Error;
  }

 End:
  if (png != NULL) {
    png_destroy_read_struct((png_structpp)&png,
                            (png_infopp)&info, (png_infopp)&end_info);
  }
  free(rgb);
  return ok;
}